

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3StrAccumEnlarge(StrAccum *p,i64 N)

{
  u32 uVar1;
  char *local_40;
  long local_38;
  i64 szNew;
  char *zOld;
  char *zNew;
  i64 N_local;
  StrAccum *p_local;
  
  if (p->accError == '\0') {
    if (p->mxAlloc == 0) {
      sqlite3StrAccumSetError(p,'\x12');
      p_local._4_4_ = (p->nAlloc - p->nChar) + -1;
    }
    else {
      if ((p->printfFlags & 4) == 0) {
        local_40 = (char *)0x0;
      }
      else {
        local_40 = p->zText;
      }
      local_38 = (ulong)p->nChar + N + 1;
      if ((long)(local_38 + (ulong)p->nChar) <= (long)(ulong)p->mxAlloc) {
        local_38 = (ulong)p->nChar + local_38;
      }
      if ((long)(ulong)p->mxAlloc < local_38) {
        sqlite3_str_reset(p);
        sqlite3StrAccumSetError(p,'\x12');
        p_local._4_4_ = 0;
      }
      else {
        p->nAlloc = (u32)local_38;
        if (p->db == (sqlite3 *)0x0) {
          zOld = (char *)sqlite3Realloc(local_40,(ulong)p->nAlloc);
        }
        else {
          zOld = (char *)sqlite3DbRealloc(p->db,local_40,(ulong)p->nAlloc);
        }
        if (zOld == (char *)0x0) {
          sqlite3_str_reset(p);
          sqlite3StrAccumSetError(p,'\a');
          p_local._4_4_ = 0;
        }
        else {
          if (((p->printfFlags & 4) == 0) && (p->nChar != 0)) {
            memcpy(zOld,p->zText,(ulong)p->nChar);
          }
          p->zText = zOld;
          uVar1 = sqlite3DbMallocSize(p->db,zOld);
          p->nAlloc = uVar1;
          p->printfFlags = p->printfFlags | 4;
          p_local._4_4_ = (int)N;
        }
      }
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3StrAccumEnlarge(StrAccum *p, i64 N){
  char *zNew;
  assert( p->nChar+N >= p->nAlloc ); /* Only called if really needed */
  if( p->accError ){
    testcase(p->accError==SQLITE_TOOBIG);
    testcase(p->accError==SQLITE_NOMEM);
    return 0;
  }
  if( p->mxAlloc==0 ){
    sqlite3StrAccumSetError(p, SQLITE_TOOBIG);
    return p->nAlloc - p->nChar - 1;
  }else{
    char *zOld = isMalloced(p) ? p->zText : 0;
    i64 szNew = p->nChar + N + 1;
    if( szNew+p->nChar<=p->mxAlloc ){
      /* Force exponential buffer size growth as long as it does not overflow,
      ** to avoid having to call this routine too often */
      szNew += p->nChar;
    }
    if( szNew > p->mxAlloc ){
      sqlite3_str_reset(p);
      sqlite3StrAccumSetError(p, SQLITE_TOOBIG);
      return 0;
    }else{
      p->nAlloc = (int)szNew;
    }
    if( p->db ){
      zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
    }else{
      zNew = sqlite3Realloc(zOld, p->nAlloc);
    }
    if( zNew ){
      assert( p->zText!=0 || p->nChar==0 );
      if( !isMalloced(p) && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
      p->zText = zNew;
      p->nAlloc = sqlite3DbMallocSize(p->db, zNew);
      p->printfFlags |= SQLITE_PRINTF_MALLOCED;
    }else{
      sqlite3_str_reset(p);
      sqlite3StrAccumSetError(p, SQLITE_NOMEM);
      return 0;
    }
  }
  assert( N>=0 && N<=0x7fffffff );
  return (int)N;
}